

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcFurnitureType::~IfcFurnitureType(IfcFurnitureType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x8b45d8;
  *(undefined8 *)&this->field_0x1c0 = 0x8b46f0;
  *(undefined8 *)&this->field_0x88 = 0x8b4600;
  *(undefined8 *)&this->field_0x98 = 0x8b4628;
  *(undefined8 *)&this->field_0xf0 = 0x8b4650;
  *(undefined8 *)&this->field_0x148 = 0x8b4678;
  *(undefined8 *)&this->field_0x180 = 0x8b46a0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8b46c8;
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).field_0x10;
  if (puVar1 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).
                 field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x8b49b8;
  *(undefined8 *)&this->field_0x1c0 = 0x8b4a80;
  *(undefined8 *)&this->field_0x88 = 0x8b49e0;
  *(undefined8 *)&this->field_0x98 = 0x8b4a08;
  *(undefined8 *)&this->field_0xf0 = 0x8b4a30;
  *(undefined8 *)&this->field_0x148 = 0x8b4a58;
  if (*(undefined1 **)&this->field_0x158 != &this->field_0x168) {
    operator_delete(*(undefined1 **)&this->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__008b4718);
  operator_delete(this);
  return;
}

Assistant:

IfcFurnitureType() : Object("IfcFurnitureType") {}